

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csg.h
# Opt level: O0

object * ocmesh::details::scale(object *node,float factor)

{
  bool bVar1;
  object *poVar2;
  tvec3<float,_(glm::precision)0> local_20;
  float local_14;
  object *poStack_10;
  float factor_local;
  object *node_local;
  
  bVar1 = false;
  if ((factor != 0.0) || (NAN(factor))) {
    bVar1 = true;
  }
  local_14 = factor;
  poStack_10 = node;
  if (bVar1) {
    glm::tvec3<float,_(glm::precision)0>::tvec3(&local_20,factor,factor,factor);
    poVar2 = scale(node,&local_20);
    return poVar2;
  }
  __assert_fail("factor != 0 && \"Scaling factor must be non-zero\"",
                "/workspace/llm4binary/github/license_all_cmakelists_25/nicola-gigante[P]ocmesh/include/csg.h"
                ,0x183,"object *ocmesh::details::scale(object *, float)");
}

Assistant:

inline object *scale(object *node, float factor) {
        assert(factor != 0 && "Scaling factor must be non-zero");
        return scale(node, { factor, factor, factor });
    }